

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_ErrorCode PHYSFS_getLastErrorCode(void)

{
  PHYSFS_ErrorCode PVar1;
  ErrState *pEVar2;
  
  pEVar2 = findErrorForCurrentThread();
  if (pEVar2 == (ErrState *)0x0) {
    PVar1 = PHYSFS_ERR_OK;
  }
  else {
    PVar1 = pEVar2->code;
    pEVar2->code = PHYSFS_ERR_OK;
  }
  return PVar1;
}

Assistant:

PHYSFS_ErrorCode PHYSFS_getLastErrorCode(void)
{
    ErrState *err = findErrorForCurrentThread();
    const PHYSFS_ErrorCode retval = (err) ? err->code : PHYSFS_ERR_OK;
    if (err)
        err->code = PHYSFS_ERR_OK;
    return retval;
}